

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_declared_builtin_block
          (CompilerGLSL *this,StorageClass storage,ExecutionModel model)

{
  uint uVar1;
  mapped_type mVar2;
  Decoration *pDVar3;
  uint3 uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint32_t uVar8;
  BuiltIn BVar9;
  StorageClass SVar10;
  uint32_t uVar11;
  ExecutionModel EVar12;
  SPIRType *pSVar13;
  mapped_type *pmVar14;
  mapped_type *pmVar15;
  iterator iVar16;
  SPIREntryPoint *pSVar17;
  CompilerError *pCVar18;
  uint32_t **ppuVar19;
  uint32_t *puVar20;
  char *pcVar21;
  SPIRVariable *pSVar22;
  int iVar23;
  ParsedIR *this_00;
  ID *__k;
  char (*in_R9) [2];
  long lVar24;
  Decoration *pDVar25;
  uint32_t geom_stream;
  uint local_290;
  uint32_t xfb_buffer;
  uint32_t xfb_stride;
  ExecutionModel local_284;
  SPIRVariable *local_280;
  uint local_274;
  undefined4 local_270;
  BuiltIn local_26c;
  char *instance_name;
  uint32_t *local_248;
  uint32_t clip_distance_size;
  uint32_t cull_distance_size;
  ParsedIR *local_238;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_230;
  SPIRType *local_228;
  uint32_t *local_220;
  TypedID<(spirv_cross::Types)0> *local_218;
  TypedID<(spirv_cross::Types)0> *local_210;
  long local_208;
  Bitset builtins;
  Bitset emitted_builtins;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  builtin_xfb_offsets;
  Bitset global_builtins;
  
  emitted_builtins.lower = 0;
  emitted_builtins.higher._M_h._M_buckets = &emitted_builtins.higher._M_h._M_single_bucket;
  emitted_builtins.higher._M_h._M_bucket_count = 1;
  emitted_builtins.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  emitted_builtins.higher._M_h._M_element_count = 0;
  emitted_builtins.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  emitted_builtins.higher._M_h._M_rehash_policy._M_next_resize = 0;
  emitted_builtins.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
  global_builtins.lower = 0;
  global_builtins.higher._M_h._M_buckets = &global_builtins.higher._M_h._M_single_bucket;
  global_builtins.higher._M_h._M_bucket_count = 1;
  global_builtins.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  global_builtins.higher._M_h._M_element_count = 0;
  local_248 = &cull_distance_size;
  cull_distance_size = 0;
  local_220 = &clip_distance_size;
  clip_distance_size = 0;
  global_builtins.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  xfb_stride = 0;
  global_builtins.higher._M_h._M_rehash_policy._M_next_resize = 0;
  global_builtins.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
  xfb_buffer = 0;
  geom_stream = 0;
  builtin_xfb_offsets._M_h._M_buckets = &builtin_xfb_offsets._M_h._M_single_bucket;
  builtin_xfb_offsets._M_h._M_bucket_count = 1;
  builtin_xfb_offsets._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  builtin_xfb_offsets._M_h._M_element_count = 0;
  builtin_xfb_offsets._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  builtin_xfb_offsets._M_h._M_rehash_policy._M_next_resize = 0;
  builtin_xfb_offsets._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = &(this->super_Compiler).ir;
  local_284 = model;
  ParsedIR::create_loop_hard_lock(this_00);
  pcVar21 = (char *)(this->super_Compiler).ir.ids_for_type[2].
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  local_218 = (TypedID<(spirv_cross::Types)0> *)
              ((long)pcVar21 +
              (this->super_Compiler).ir.ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size * 4);
  local_230 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)&(this->super_Compiler).ir.meta;
  local_270 = 0;
  bVar5 = false;
  local_290 = 0;
  local_274 = 0;
  local_238 = this_00;
  while ((TypedID<(spirv_cross::Types)0> *)pcVar21 != local_218) {
    local_210 = (TypedID<(spirv_cross::Types)0> *)pcVar21;
    if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
        [((TypedID<(spirv_cross::Types)0> *)pcVar21)->id].type == TypeVariable) {
      local_280 = ParsedIR::get<spirv_cross::SPIRVariable>
                            (this_00,((TypedID<(spirv_cross::Types)0> *)pcVar21)->id);
      pSVar13 = Compiler::get<spirv_cross::SPIRType>
                          (&this->super_Compiler,*(uint32_t *)&(local_280->super_IVariant).field_0xc
                          );
      bVar6 = Compiler::has_decoration
                        (&this->super_Compiler,(ID)(pSVar13->super_IVariant).self.id,Block);
      builtins.lower = 0;
      builtins.higher._M_h._M_buckets = &builtins.higher._M_h._M_single_bucket;
      builtins.higher._M_h._M_bucket_count = 1;
      builtins.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      builtins.higher._M_h._M_element_count = 0;
      builtins.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      builtins.higher._M_h._M_rehash_policy._M_next_resize = 0;
      builtins.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
      SVar10 = local_280->storage;
      if (bVar6 && SVar10 == storage) {
        bVar7 = Compiler::is_builtin_variable(&this->super_Compiler,local_280);
        if (!bVar7) {
          SVar10 = local_280->storage;
          goto LAB_002d6e16;
        }
        local_228 = pSVar13;
        pmVar14 = ::std::__detail::
                  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](local_230,&(pSVar13->super_IVariant).self);
        local_208 = (pmVar14->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size *
                    0x188;
        pDVar3 = (pmVar14->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
        puVar20 = (uint32_t *)0x0;
        pSVar22 = local_280;
        pDVar25 = pDVar3;
        for (lVar24 = 0; local_208 != lVar24; lVar24 = lVar24 + 0x188) {
          iVar23 = (int)puVar20;
          if (((pDVar25->builtin == true) &&
              (uVar1 = *(uint *)((long)(pDVar3->extended).values + lVar24 + -0x80), uVar1 < 5)) &&
             (uVar1 != 2)) {
            Bitset::set(&builtins,uVar1);
            BVar9 = *(BuiltIn *)((long)(pDVar3->extended).values + lVar24 + -0x80);
            if (BVar9 == BuiltInClipDistance) {
              pSVar13 = Compiler::get<spirv_cross::SPIRType>
                                  (&this->super_Compiler,
                                   (local_228->member_types).
                                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                   ptr[(long)puVar20].id);
              uVar8 = to_array_size_literal(this,pSVar13);
              ppuVar19 = &local_220;
LAB_002d6d68:
              puVar20 = *ppuVar19;
              *puVar20 = uVar8;
              BVar9 = *(BuiltIn *)((long)(pDVar3->extended).values + lVar24 + -0x80);
            }
            else if (BVar9 == BuiltInCullDistance) {
              pSVar13 = Compiler::get<spirv_cross::SPIRType>
                                  (&this->super_Compiler,
                                   (local_228->member_types).
                                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                   ptr[(long)puVar20].id);
              uVar8 = to_array_size_literal(this,pSVar13);
              ppuVar19 = &local_248;
              goto LAB_002d6d68;
            }
            if (((BVar9 < BuiltInVertexId) && (BVar9 != 2)) &&
               ((*(byte *)((long)&(pDVar3->decoration_flags).lower + lVar24 + 4) & 8) != 0)) {
              mVar2 = *(mapped_type *)((long)(pDVar3->extended).values + lVar24 + -0x6c);
              local_26c = BVar9;
              pmVar15 = ::std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&builtin_xfb_offsets,&local_26c);
              *pmVar15 = mVar2;
              BVar9 = *(BuiltIn *)((long)(pDVar3->extended).values + lVar24 + -0x80);
              local_270 = (undefined4)CONCAT71((int7)((ulong)puVar20 >> 8),1);
              pSVar22 = local_280;
            }
            if (((BVar9 < BuiltInVertexId) && (BVar9 != 2)) &&
               ((*(byte *)((long)&(pDVar3->decoration_flags).lower + lVar24 + 3) & 0x20) != 0)) {
              uVar8 = *(uint32_t *)((long)(pDVar3->extended).values + lVar24 + -0x60);
              if ((bVar5) && (geom_stream != uVar8)) {
                pCVar18 = (CompilerError *)__cxa_allocate_exception(0x10);
                CompilerError::CompilerError(pCVar18,"IO block member Stream mismatch.");
                __cxa_throw(pCVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
              bVar5 = true;
              geom_stream = uVar8;
            }
          }
          puVar20 = (uint32_t *)(ulong)(iVar23 + 1);
          pDVar25 = pDVar25 + 1;
        }
        this_00 = local_238;
        if (storage != Output) goto LAB_002d7077;
        bVar6 = Compiler::has_decoration
                          (&this->super_Compiler,(ID)(pSVar22->super_IVariant).self.id,
                           DecorationXfbBuffer);
        this_00 = local_238;
        if ((bVar6) &&
           (bVar6 = Compiler::has_decoration
                              (&this->super_Compiler,(ID)(pSVar22->super_IVariant).self.id,
                               DecorationXfbStride), bVar6)) {
          uVar8 = Compiler::get_decoration
                            (&this->super_Compiler,(ID)(pSVar22->super_IVariant).self.id,
                             DecorationXfbBuffer);
          uVar11 = Compiler::get_decoration
                             (&this->super_Compiler,(ID)(pSVar22->super_IVariant).self.id,
                              DecorationXfbStride);
          if ((local_290 & 1) != 0) {
            if (uVar8 != xfb_buffer) {
              pCVar18 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError(pCVar18,"IO block member XfbBuffer mismatch.");
LAB_002d77c0:
              __cxa_throw(pCVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            if (uVar11 != xfb_stride) {
              pCVar18 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError(pCVar18,"IO block member XfbBuffer mismatch.");
              goto LAB_002d77c0;
            }
          }
          local_290 = (uint)CONCAT71((uint7)(uint3)(uVar11 >> 8),1);
          pSVar22 = local_280;
          xfb_buffer = uVar8;
          xfb_stride = uVar11;
        }
        bVar6 = Compiler::has_decoration
                          (&this->super_Compiler,(ID)(pSVar22->super_IVariant).self.id,
                           DecorationStream);
        if (!bVar6) goto LAB_002d7077;
        uVar8 = Compiler::get_decoration
                          (&this->super_Compiler,(ID)(pSVar22->super_IVariant).self.id,
                           DecorationStream);
        if ((bVar5) && (geom_stream != uVar8)) {
          pCVar18 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar18,"IO block member Stream mismatch.");
          __cxa_throw(pCVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
LAB_002d706d:
        geom_stream = uVar8;
        bVar5 = true;
      }
      else {
LAB_002d6e16:
        if ((!bVar6 && SVar10 == storage) &&
           (bVar6 = Compiler::is_builtin_variable(&this->super_Compiler,local_280), bVar6)) {
          __k = &(local_280->super_IVariant).self;
          pmVar14 = ::std::__detail::
                    _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](local_230,__k);
          if (((pmVar14->decoration).builtin == true) &&
             ((BVar9 = (pmVar14->decoration).builtin_type, BVar9 < BuiltInVertexId && (BVar9 != 2)))
             ) {
            Bitset::set(&global_builtins,BVar9);
            BVar9 = (pmVar14->decoration).builtin_type;
            if (BVar9 == BuiltInClipDistance) {
              uVar8 = to_array_size_literal(this,pSVar13,0);
              ppuVar19 = &local_220;
LAB_002d6fa4:
              **ppuVar19 = uVar8;
              BVar9 = (pmVar14->decoration).builtin_type;
            }
            else if (BVar9 == BuiltInCullDistance) {
              uVar8 = to_array_size_literal(this,pSVar13,0);
              ppuVar19 = &local_248;
              goto LAB_002d6fa4;
            }
            if (((BVar9 < BuiltInVertexId) && (BVar9 != 2)) &&
               ((~(pmVar14->decoration).decoration_flags.lower & 0x3800000000) == 0)) {
              uVar8 = (pmVar14->decoration).offset;
              local_26c = BVar9;
              pmVar15 = ::std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&builtin_xfb_offsets,&local_26c);
              *pmVar15 = uVar8;
              uVar8 = (pmVar14->decoration).xfb_buffer;
              uVar11 = (pmVar14->decoration).xfb_stride;
              if ((local_290 & 1) != 0) {
                if (uVar8 != xfb_buffer) {
                  pCVar18 = (CompilerError *)__cxa_allocate_exception(0x10);
                  CompilerError::CompilerError(pCVar18,"IO block member XfbBuffer mismatch.");
LAB_002d780c:
                  __cxa_throw(pCVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error)
                  ;
                }
                if (uVar11 != xfb_stride) {
                  pCVar18 = (CompilerError *)__cxa_allocate_exception(0x10);
                  CompilerError::CompilerError(pCVar18,"IO block member XfbBuffer mismatch.");
                  goto LAB_002d780c;
                }
              }
              BVar9 = (pmVar14->decoration).builtin_type;
              uVar4 = (uint3)(uVar11 >> 8);
              local_270 = (undefined4)CONCAT71((uint7)uVar4,1);
              local_290 = CONCAT31(uVar4,1);
              this_00 = local_238;
              xfb_buffer = uVar8;
              xfb_stride = uVar11;
            }
            if (((BVar9 < BuiltInVertexId) && (BVar9 != 2)) &&
               (((pmVar14->decoration).decoration_flags.lower & 0x20000000) != 0)) {
              uVar8 = Compiler::get_decoration(&this->super_Compiler,(ID)__k->id,DecorationStream);
              if ((bVar5) && (geom_stream != uVar8)) {
                pCVar18 = (CompilerError *)__cxa_allocate_exception(0x10);
                CompilerError::CompilerError(pCVar18,"IO block member Stream mismatch.");
                __cxa_throw(pCVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
              goto LAB_002d706d;
            }
          }
        }
      }
LAB_002d7077:
      if ((builtins.higher._M_h._M_element_count | builtins.lower) != 0) {
        if ((local_274 & 1) != 0) {
          pCVar18 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar18,"Cannot use more than one builtin I/O block.");
          __cxa_throw(pCVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_274 = (uint)CONCAT71((int7)((builtins.higher._M_h._M_element_count | builtins.lower)
                                         >> 8),1);
        Bitset::operator=(&emitted_builtins,&builtins);
      }
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&builtins.higher._M_h);
    }
    pcVar21 = (char *)(local_210 + 1);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&instance_name);
  builtins.lower = (uint64_t)((uint)global_builtins.lower & 0x1b);
  builtins.higher._M_h._M_buckets = &builtins.higher._M_h._M_single_bucket;
  builtins.higher._M_h._M_bucket_count = 1;
  builtins.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  builtins.higher._M_h._M_element_count = 0;
  builtins.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  builtins.higher._M_h._M_rehash_policy._M_next_resize = 0;
  builtins.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Bitset::operator=(&global_builtins,&builtins);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&builtins.higher._M_h);
  if ((local_274 & 1) == 0) {
    Bitset::operator=(&emitted_builtins,&global_builtins);
  }
  if (emitted_builtins.higher._M_h._M_element_count != 0 || emitted_builtins.lower != 0) {
    if (storage == Output) {
      builtins.higher._M_h._M_buckets = (__buckets_ptr)0x0;
      builtins.lower = (uint64_t)&builtins.higher._M_h._M_before_begin;
      builtins.higher._M_h._M_bucket_count = 8;
      if (((byte)local_290 & (byte)local_270 & 1) != 0) {
        if ((this->options).es != false) {
          pCVar18 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar18,"Need GL_ARB_enhanced_layouts for xfb_stride or xfb_buffer.");
          goto LAB_002d7890;
        }
        uVar1 = (this->options).version;
        if (uVar1 - 0x8c < 300) {
          ::std::__cxx11::string::string
                    ((string *)&instance_name,"GL_ARB_enhanced_layouts",(allocator *)&local_248);
          require_extension_internal(this,(string *)&instance_name);
          ::std::__cxx11::string::~string((string *)&instance_name);
          if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x1b8)) {
            ::std::__cxx11::string::string
                      ((string *)&instance_name,"GL_ARB_enhanced_layouts",(allocator *)&local_248);
            require_extension_internal(this,(string *)&instance_name);
            ::std::__cxx11::string::~string((string *)&instance_name);
          }
        }
        else if (uVar1 < 0x8c) {
          pCVar18 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar18,"Component decoration is not supported in targets below GLSL 1.40.");
          goto LAB_002d7890;
        }
        pcVar21 = ", xfb_stride = ";
        join<char_const(&)[14],unsigned_int&,char_const(&)[16],unsigned_int&>
                  ((string *)&instance_name,(spirv_cross *)"xfb_buffer = ",
                   (char (*) [14])&xfb_buffer,(uint *)", xfb_stride = ",(char (*) [16])&xfb_stride,
                   (uint *)in_R9);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&builtins,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &instance_name);
        ::std::__cxx11::string::~string((string *)&instance_name);
      }
      if (bVar5) {
        EVar12 = Compiler::get_execution_model(&this->super_Compiler);
        if (EVar12 != ExecutionModelGeometry) {
          pCVar18 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar18,"Geometry streams can only be used in geometry shaders.");
LAB_002d7890:
          __cxa_throw(pCVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((this->options).es == true) {
          pCVar18 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar18,"Multiple geometry streams not supported in ESSL.");
          goto LAB_002d7890;
        }
        if ((this->options).version < 400) {
          ::std::__cxx11::string::string
                    ((string *)&instance_name,"GL_ARB_transform_feedback3",(allocator *)&local_248);
          require_extension_internal(this,(string *)&instance_name);
          ::std::__cxx11::string::~string((string *)&instance_name);
        }
        join<char_const(&)[10],unsigned_int&>
                  ((string *)&instance_name,(spirv_cross *)"stream = ",(char (*) [10])&geom_stream,
                   (uint *)pcVar21);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&builtins,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &instance_name);
        ::std::__cxx11::string::~string((string *)&instance_name);
      }
      if (local_284 == ExecutionModelMeshEXT) {
        statement<char_const(&)[24]>(this,(char (*) [24])"out gl_MeshPerVertexEXT");
      }
      else if (builtins.higher._M_h._M_buckets == (__buckets_ptr)0x0) {
        statement<char_const(&)[17]>(this,(char (*) [17])0x3a37ad);
      }
      else {
        merge((string *)&instance_name,
              (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
               *)&builtins,", ");
        statement<char_const(&)[8],std::__cxx11::string,char_const(&)[19]>
                  (this,(char (*) [8])"layout(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &instance_name,(char (*) [19])") out gl_PerVertex");
        ::std::__cxx11::string::~string((string *)&instance_name);
      }
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                      *)&builtins);
    }
    else {
      pSVar17 = Compiler::get_entry_point(&this->super_Compiler);
      if (pSVar17->geometry_passthrough == true) {
        statement<char_const(&)[36]>(this,(char (*) [36])"layout(passthrough) in gl_PerVertex");
      }
      else {
        statement<char_const(&)[16]>(this,(char (*) [16])0x3a37d2);
      }
    }
    begin_scope(this);
    if ((emitted_builtins.lower & 1) != 0) {
      builtins.lower = builtins.lower & 0xffffffff00000000;
      iVar16 = ::std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&builtin_xfb_offsets._M_h,(key_type_conflict *)&builtins);
      if (iVar16.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
          _M_cur == (__node_type *)0x0) {
        if ((this->super_Compiler).position_invariant == true) {
          statement<char_const(&)[28]>(this,(char (*) [28])"invariant vec4 gl_Position;");
        }
        else {
          statement<char_const(&)[18]>(this,(char (*) [18])0x3a37f9);
        }
      }
      else {
        statement<char_const(&)[21],unsigned_int&,char_const(&)[20]>
                  (this,(char (*) [21])"layout(xfb_offset = ",
                   (uint *)((long)iVar16.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                  ._M_cur + 0xc),(char (*) [20])") vec4 gl_Position;");
      }
    }
    if ((emitted_builtins.lower & 2) != 0) {
      builtins.lower = CONCAT44(builtins.lower._4_4_,1);
      iVar16 = ::std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&builtin_xfb_offsets._M_h,(key_type_conflict *)&builtins);
      if (iVar16.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
          _M_cur == (__node_type *)0x0) {
        statement<char_const(&)[20]>(this,(char (*) [20])0x3a3829);
      }
      else {
        statement<char_const(&)[21],unsigned_int&,char_const(&)[22]>
                  (this,(char (*) [21])"layout(xfb_offset = ",
                   (uint *)((long)iVar16.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                  ._M_cur + 0xc),(char (*) [22])") float gl_PointSize;");
      }
    }
    if ((emitted_builtins.lower & 8) != 0) {
      builtins.lower = CONCAT44(builtins.lower._4_4_,3);
      iVar16 = ::std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&builtin_xfb_offsets._M_h,(key_type_conflict *)&builtins);
      if (iVar16.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
          _M_cur == (__node_type *)0x0) {
        statement<char_const(&)[23],unsigned_int&,char_const(&)[3]>
                  (this,(char (*) [23])0x3a383f,&clip_distance_size,(char (*) [3])0x388bf5);
      }
      else {
        in_R9 = (char (*) [2])0x388bf5;
        statement<char_const(&)[21],unsigned_int&,char_const(&)[25],unsigned_int&,char_const(&)[3]>
                  (this,(char (*) [21])"layout(xfb_offset = ",
                   (uint *)((long)iVar16.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                  ._M_cur + 0xc),(char (*) [25])") float gl_ClipDistance[",
                   &clip_distance_size,(char (*) [3])0x388bf5);
      }
    }
    if ((emitted_builtins.lower & 0x10) != 0) {
      builtins.lower = CONCAT44(builtins.lower._4_4_,4);
      iVar16 = ::std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&builtin_xfb_offsets._M_h,(key_type_conflict *)&builtins);
      if (iVar16.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
          _M_cur == (__node_type *)0x0) {
        statement<char_const(&)[23],unsigned_int&,char_const(&)[3]>
                  (this,(char (*) [23])0x3a3858,&cull_distance_size,(char (*) [3])0x388bf5);
      }
      else {
        in_R9 = (char (*) [2])0x388bf5;
        statement<char_const(&)[21],unsigned_int&,char_const(&)[25],unsigned_int&,char_const(&)[3]>
                  (this,(char (*) [21])"layout(xfb_offset = ",
                   (uint *)((long)iVar16.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                  ._M_cur + 0xc),(char (*) [25])") float gl_CullDistance[",
                   &cull_distance_size,(char (*) [3])0x388bf5);
      }
    }
    if (((local_284 == ExecutionModelTessellationControl) ||
        (local_284 == ExecutionModelMeshEXT && (storage ^ Output) == StorageClassUniformConstant))
       || ((local_284 & ~ExecutionModelTessellationControl) == ExecutionModelTessellationEvaluation
           && storage == Input)) {
      pcVar21 = "gl_out";
      if (storage == Input) {
        pcVar21 = "gl_in";
      }
      instance_name = "gl_MeshVerticesEXT";
      if (local_284 != ExecutionModelMeshEXT) {
        instance_name = pcVar21;
      }
      if ((storage ^ Output) == StorageClassUniformConstant &&
          (local_284 ^ ExecutionModelTessellationControl) == ExecutionModelVertex) {
        pSVar17 = Compiler::get_entry_point(&this->super_Compiler);
        join<char_const*&,char_const(&)[2],unsigned_int&,char_const(&)[2]>
                  ((string *)&builtins,(spirv_cross *)&instance_name,(char **)0x349808,
                   (char (*) [2])&pSVar17->output_vertices,(uint *)0x38a005,in_R9);
        end_scope_decl(this,(string *)&builtins);
      }
      else {
        join<char_const*&,char_const(&)[3]>
                  ((string *)&builtins,(spirv_cross *)&instance_name,(char **)"[]",
                   (char (*) [3])(ulong)(local_284 ^ ExecutionModelTessellationControl));
        end_scope_decl(this,(string *)&builtins);
      }
      ::std::__cxx11::string::~string((string *)&builtins);
    }
    else {
      end_scope_decl(this);
    }
    statement<char_const(&)[1]>(this,(char (*) [1])0x381f19);
  }
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&builtin_xfb_offsets._M_h);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&global_builtins.higher._M_h);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&emitted_builtins.higher._M_h);
  return;
}

Assistant:

void CompilerGLSL::emit_declared_builtin_block(StorageClass storage, ExecutionModel model)
{
	Bitset emitted_builtins;
	Bitset global_builtins;
	const SPIRVariable *block_var = nullptr;
	bool emitted_block = false;

	// Need to use declared size in the type.
	// These variables might have been declared, but not statically used, so we haven't deduced their size yet.
	uint32_t cull_distance_size = 0;
	uint32_t clip_distance_size = 0;

	bool have_xfb_buffer_stride = false;
	bool have_geom_stream = false;
	bool have_any_xfb_offset = false;
	uint32_t xfb_stride = 0, xfb_buffer = 0, geom_stream = 0;
	std::unordered_map<uint32_t, uint32_t> builtin_xfb_offsets;

	const auto builtin_is_per_vertex_set = [](BuiltIn builtin) -> bool {
		return builtin == BuiltInPosition || builtin == BuiltInPointSize ||
			builtin == BuiltInClipDistance || builtin == BuiltInCullDistance;
	};

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		bool block = has_decoration(type.self, DecorationBlock);
		Bitset builtins;

		if (var.storage == storage && block && is_builtin_variable(var))
		{
			uint32_t index = 0;
			for (auto &m : ir.meta[type.self].members)
			{
				if (m.builtin && builtin_is_per_vertex_set(m.builtin_type))
				{
					builtins.set(m.builtin_type);
					if (m.builtin_type == BuiltInCullDistance)
						cull_distance_size = to_array_size_literal(this->get<SPIRType>(type.member_types[index]));
					else if (m.builtin_type == BuiltInClipDistance)
						clip_distance_size = to_array_size_literal(this->get<SPIRType>(type.member_types[index]));

					if (is_block_builtin(m.builtin_type) && m.decoration_flags.get(DecorationOffset))
					{
						have_any_xfb_offset = true;
						builtin_xfb_offsets[m.builtin_type] = m.offset;
					}

					if (is_block_builtin(m.builtin_type) && m.decoration_flags.get(DecorationStream))
					{
						uint32_t stream = m.stream;
						if (have_geom_stream && geom_stream != stream)
							SPIRV_CROSS_THROW("IO block member Stream mismatch.");
						have_geom_stream = true;
						geom_stream = stream;
					}
				}
				index++;
			}

			if (storage == StorageClassOutput && has_decoration(var.self, DecorationXfbBuffer) &&
			    has_decoration(var.self, DecorationXfbStride))
			{
				uint32_t buffer_index = get_decoration(var.self, DecorationXfbBuffer);
				uint32_t stride = get_decoration(var.self, DecorationXfbStride);
				if (have_xfb_buffer_stride && buffer_index != xfb_buffer)
					SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
				if (have_xfb_buffer_stride && stride != xfb_stride)
					SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
				have_xfb_buffer_stride = true;
				xfb_buffer = buffer_index;
				xfb_stride = stride;
			}

			if (storage == StorageClassOutput && has_decoration(var.self, DecorationStream))
			{
				uint32_t stream = get_decoration(var.self, DecorationStream);
				if (have_geom_stream && geom_stream != stream)
					SPIRV_CROSS_THROW("IO block member Stream mismatch.");
				have_geom_stream = true;
				geom_stream = stream;
			}
		}
		else if (var.storage == storage && !block && is_builtin_variable(var))
		{
			// While we're at it, collect all declared global builtins (HLSL mostly ...).
			auto &m = ir.meta[var.self].decoration;
			if (m.builtin && builtin_is_per_vertex_set(m.builtin_type))
			{
				// For mesh/tesc output, Clip/Cull is an array-of-array. Look at innermost array type
				// for correct result.
				global_builtins.set(m.builtin_type);
				if (m.builtin_type == BuiltInCullDistance)
					cull_distance_size = to_array_size_literal(type, 0);
				else if (m.builtin_type == BuiltInClipDistance)
					clip_distance_size = to_array_size_literal(type, 0);

				if (is_block_builtin(m.builtin_type) && m.decoration_flags.get(DecorationXfbStride) &&
				    m.decoration_flags.get(DecorationXfbBuffer) && m.decoration_flags.get(DecorationOffset))
				{
					have_any_xfb_offset = true;
					builtin_xfb_offsets[m.builtin_type] = m.offset;
					uint32_t buffer_index = m.xfb_buffer;
					uint32_t stride = m.xfb_stride;
					if (have_xfb_buffer_stride && buffer_index != xfb_buffer)
						SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
					if (have_xfb_buffer_stride && stride != xfb_stride)
						SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
					have_xfb_buffer_stride = true;
					xfb_buffer = buffer_index;
					xfb_stride = stride;
				}

				if (is_block_builtin(m.builtin_type) && m.decoration_flags.get(DecorationStream))
				{
					uint32_t stream = get_decoration(var.self, DecorationStream);
					if (have_geom_stream && geom_stream != stream)
						SPIRV_CROSS_THROW("IO block member Stream mismatch.");
					have_geom_stream = true;
					geom_stream = stream;
				}
			}
		}

		if (builtins.empty())
			return;

		if (emitted_block)
			SPIRV_CROSS_THROW("Cannot use more than one builtin I/O block.");

		emitted_builtins = builtins;
		emitted_block = true;
		block_var = &var;
	});

	global_builtins =
	    Bitset(global_builtins.get_lower() & ((1ull << BuiltInPosition) | (1ull << BuiltInPointSize) |
	                                          (1ull << BuiltInClipDistance) | (1ull << BuiltInCullDistance)));

	// Try to collect all other declared builtins.
	if (!emitted_block)
		emitted_builtins = global_builtins;

	// Can't declare an empty interface block.
	if (emitted_builtins.empty())
		return;

	if (storage == StorageClassOutput)
	{
		SmallVector<string> attr;
		if (have_xfb_buffer_stride && have_any_xfb_offset)
		{
			if (!options.es)
			{
				if (options.version < 440 && options.version >= 140)
					require_extension_internal("GL_ARB_enhanced_layouts");
				else if (options.version < 140)
					SPIRV_CROSS_THROW("Component decoration is not supported in targets below GLSL 1.40.");
				if (!options.es && options.version < 440)
					require_extension_internal("GL_ARB_enhanced_layouts");
			}
			else if (options.es)
				SPIRV_CROSS_THROW("Need GL_ARB_enhanced_layouts for xfb_stride or xfb_buffer.");
			attr.push_back(join("xfb_buffer = ", xfb_buffer, ", xfb_stride = ", xfb_stride));
		}

		if (have_geom_stream)
		{
			if (get_execution_model() != ExecutionModelGeometry)
				SPIRV_CROSS_THROW("Geometry streams can only be used in geometry shaders.");
			if (options.es)
				SPIRV_CROSS_THROW("Multiple geometry streams not supported in ESSL.");
			if (options.version < 400)
				require_extension_internal("GL_ARB_transform_feedback3");
			attr.push_back(join("stream = ", geom_stream));
		}

		if (model == ExecutionModelMeshEXT)
			statement("out gl_MeshPerVertexEXT");
		else if (!attr.empty())
			statement("layout(", merge(attr), ") out gl_PerVertex");
		else
			statement("out gl_PerVertex");
	}
	else
	{
		// If we have passthrough, there is no way PerVertex cannot be passthrough.
		if (get_entry_point().geometry_passthrough)
			statement("layout(passthrough) in gl_PerVertex");
		else
			statement("in gl_PerVertex");
	}

	begin_scope();
	if (emitted_builtins.get(BuiltInPosition))
	{
		auto itr = builtin_xfb_offsets.find(BuiltInPosition);
		if (itr != end(builtin_xfb_offsets))
			statement("layout(xfb_offset = ", itr->second, ") vec4 gl_Position;");
		else if (position_invariant)
			statement("invariant vec4 gl_Position;");
		else
			statement("vec4 gl_Position;");
	}

	if (emitted_builtins.get(BuiltInPointSize))
	{
		auto itr = builtin_xfb_offsets.find(BuiltInPointSize);
		if (itr != end(builtin_xfb_offsets))
			statement("layout(xfb_offset = ", itr->second, ") float gl_PointSize;");
		else
			statement("float gl_PointSize;");
	}

	if (emitted_builtins.get(BuiltInClipDistance))
	{
		auto itr = builtin_xfb_offsets.find(BuiltInClipDistance);
		if (itr != end(builtin_xfb_offsets))
			statement("layout(xfb_offset = ", itr->second, ") float gl_ClipDistance[", clip_distance_size, "];");
		else
			statement("float gl_ClipDistance[", clip_distance_size, "];");
	}

	if (emitted_builtins.get(BuiltInCullDistance))
	{
		auto itr = builtin_xfb_offsets.find(BuiltInCullDistance);
		if (itr != end(builtin_xfb_offsets))
			statement("layout(xfb_offset = ", itr->second, ") float gl_CullDistance[", cull_distance_size, "];");
		else
			statement("float gl_CullDistance[", cull_distance_size, "];");
	}

	bool builtin_array = model == ExecutionModelTessellationControl ||
	                     (model == ExecutionModelMeshEXT && storage == StorageClassOutput) ||
	                     (model == ExecutionModelGeometry && storage == StorageClassInput) ||
	                     (model == ExecutionModelTessellationEvaluation && storage == StorageClassInput);

	if (builtin_array)
	{
		const char *instance_name;
		if (model == ExecutionModelMeshEXT)
			instance_name = "gl_MeshVerticesEXT"; // Per primitive is never synthesized.
		else
			instance_name = storage == StorageClassInput ? "gl_in" : "gl_out";

		if (model == ExecutionModelTessellationControl && storage == StorageClassOutput)
			end_scope_decl(join(instance_name, "[", get_entry_point().output_vertices, "]"));
		else
			end_scope_decl(join(instance_name, "[]"));
	}
	else
		end_scope_decl();
	statement("");
}